

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse.cc
# Opt level: O0

void re2::AddUGroup(CharClassBuilder *cc,UGroup *g,int sign,ParseFlags parse_flags)

{
  ParseFlags PVar1;
  bool bVar2;
  int local_84;
  int local_80;
  int i_3;
  int i_2;
  int next;
  bool cutnl;
  undefined1 local_68 [8];
  CharClassBuilder ccb1;
  int i_1;
  int i;
  ParseFlags parse_flags_local;
  int sign_local;
  UGroup *g_local;
  CharClassBuilder *cc_local;
  
  if (sign == 1) {
    for (ccb1.ranges_._M_t._M_impl.super__Rb_tree_header._M_node_count._4_4_ = 0;
        ccb1.ranges_._M_t._M_impl.super__Rb_tree_header._M_node_count._4_4_ < g->nr16;
        ccb1.ranges_._M_t._M_impl.super__Rb_tree_header._M_node_count._4_4_ =
             ccb1.ranges_._M_t._M_impl.super__Rb_tree_header._M_node_count._4_4_ + 1) {
      CharClassBuilder::AddRangeFlags
                (cc,(uint)g->r16[ccb1.ranges_._M_t._M_impl.super__Rb_tree_header._M_node_count._4_4_
                                ].lo,
                 (uint)g->r16[ccb1.ranges_._M_t._M_impl.super__Rb_tree_header._M_node_count._4_4_].
                       hi,parse_flags);
    }
    for (ccb1.ranges_._M_t._M_impl.super__Rb_tree_header._M_node_count._0_4_ = 0;
        (int)ccb1.ranges_._M_t._M_impl.super__Rb_tree_header._M_node_count < g->nr32;
        ccb1.ranges_._M_t._M_impl.super__Rb_tree_header._M_node_count._0_4_ =
             (int)ccb1.ranges_._M_t._M_impl.super__Rb_tree_header._M_node_count + 1) {
      CharClassBuilder::AddRangeFlags
                (cc,g->r32[(int)ccb1.ranges_._M_t._M_impl.super__Rb_tree_header._M_node_count].lo,
                 g->r32[(int)ccb1.ranges_._M_t._M_impl.super__Rb_tree_header._M_node_count].hi,
                 parse_flags);
    }
  }
  else {
    PVar1 = operator&(parse_flags,FoldCase);
    if (PVar1 == NoParseFlags) {
      i_3 = 0;
      for (local_80 = 0; local_80 < g->nr16; local_80 = local_80 + 1) {
        if ((uint)i_3 < (uint)g->r16[local_80].lo) {
          CharClassBuilder::AddRangeFlags(cc,i_3,g->r16[local_80].lo - 1,parse_flags);
        }
        i_3 = g->r16[local_80].hi + 1;
      }
      for (local_84 = 0; local_84 < g->nr32; local_84 = local_84 + 1) {
        if (i_3 < g->r32[local_84].lo) {
          CharClassBuilder::AddRangeFlags(cc,i_3,g->r32[local_84].lo + -1,parse_flags);
        }
        i_3 = g->r32[local_84].hi + 1;
      }
      if (i_3 < 0x110000) {
        CharClassBuilder::AddRangeFlags(cc,i_3,0x10ffff,parse_flags);
      }
    }
    else {
      CharClassBuilder::CharClassBuilder((CharClassBuilder *)local_68);
      AddUGroup((CharClassBuilder *)local_68,g,1,parse_flags);
      PVar1 = operator&(parse_flags,ClassNL);
      bVar2 = true;
      if (PVar1 != NoParseFlags) {
        PVar1 = operator&(parse_flags,NeverNL);
        bVar2 = PVar1 != NoParseFlags;
      }
      if (bVar2) {
        CharClassBuilder::AddRange((CharClassBuilder *)local_68,10,10);
      }
      CharClassBuilder::Negate((CharClassBuilder *)local_68);
      CharClassBuilder::AddCharClass(cc,(CharClassBuilder *)local_68);
      CharClassBuilder::~CharClassBuilder((CharClassBuilder *)local_68);
    }
  }
  return;
}

Assistant:

static void AddUGroup(CharClassBuilder *cc, const UGroup *g, int sign,
                      Regexp::ParseFlags parse_flags) {
  if (sign == +1) {
    for (int i = 0; i < g->nr16; i++) {
      cc->AddRangeFlags(g->r16[i].lo, g->r16[i].hi, parse_flags);
    }
    for (int i = 0; i < g->nr32; i++) {
      cc->AddRangeFlags(g->r32[i].lo, g->r32[i].hi, parse_flags);
    }
  } else {
    if (parse_flags & Regexp::FoldCase) {
      // Normally adding a case-folded group means
      // adding all the extra fold-equivalent runes too.
      // But if we're adding the negation of the group,
      // we have to exclude all the runes that are fold-equivalent
      // to what's already missing.  Too hard, so do in two steps.
      CharClassBuilder ccb1;
      AddUGroup(&ccb1, g, +1, parse_flags);
      // If the flags say to take out \n, put it in, so that negating will take it out.
      // Normally AddRangeFlags does this, but we're bypassing AddRangeFlags.
      bool cutnl = !(parse_flags & Regexp::ClassNL) ||
                   (parse_flags & Regexp::NeverNL);
      if (cutnl) {
        ccb1.AddRange('\n', '\n');
      }
      ccb1.Negate();
      cc->AddCharClass(&ccb1);
      return;
    }
    int next = 0;
    for (int i = 0; i < g->nr16; i++) {
      if (next < g->r16[i].lo)
        cc->AddRangeFlags(next, g->r16[i].lo - 1, parse_flags);
      next = g->r16[i].hi + 1;
    }
    for (int i = 0; i < g->nr32; i++) {
      if (next < g->r32[i].lo)
        cc->AddRangeFlags(next, g->r32[i].lo - 1, parse_flags);
      next = g->r32[i].hi + 1;
    }
    if (next <= Runemax)
      cc->AddRangeFlags(next, Runemax, parse_flags);
  }
}